

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  qreal *pqVar2;
  bool bVar3;
  QColor *color;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar4;
  QColor QVar5;
  QPointF QVar6;
  void *_v_1;
  void *_v;
  QGraphicsDropShadowEffect *_t;
  QColor *in_stack_ffffffffffffff48;
  QColor *in_stack_ffffffffffffff50;
  QGraphicsDropShadowEffect *in_stack_ffffffffffffff58;
  QGraphicsDropShadowEffect *in_stack_ffffffffffffff60;
  QGraphicsDropShadowEffect *in_stack_ffffffffffffff68;
  qreal local_38;
  undefined4 local_30;
  undefined2 uStack_2c;
  qreal local_28;
  qreal local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff60 = (QGraphicsDropShadowEffect *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff60) {
    case (QGraphicsDropShadowEffect *)0x0:
      offsetChanged((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff50,
                    (QPointF *)in_stack_ffffffffffffff48);
      break;
    case (QGraphicsDropShadowEffect *)0x1:
      blurRadiusChanged((QGraphicsDropShadowEffect *)0x4a669b,(qreal)in_stack_ffffffffffffff48);
      break;
    case (QGraphicsDropShadowEffect *)0x2:
      colorChanged((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
      ;
      break;
    case (QGraphicsDropShadowEffect *)0x3:
      setOffset(in_stack_ffffffffffffff58,(QPointF *)in_stack_ffffffffffffff50);
      break;
    case (QGraphicsDropShadowEffect *)0x4:
      setOffset(in_stack_ffffffffffffff68,(qreal)in_stack_ffffffffffffff60,
                (qreal)in_stack_ffffffffffffff58);
      break;
    case (QGraphicsDropShadowEffect *)0x5:
      setOffset(in_stack_ffffffffffffff58,(qreal)in_stack_ffffffffffffff50);
      break;
    case (QGraphicsDropShadowEffect *)0x6:
      setXOffset(in_stack_ffffffffffffff68,(qreal)in_stack_ffffffffffffff60);
      break;
    case (QGraphicsDropShadowEffect *)0x7:
      setYOffset(in_stack_ffffffffffffff58,(qreal)in_stack_ffffffffffffff50);
      break;
    case (QGraphicsDropShadowEffect *)0x8:
      setBlurRadius(in_stack_ffffffffffffff60,(qreal)in_stack_ffffffffffffff58);
      break;
    case (QGraphicsDropShadowEffect *)0x9:
      setColor(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    }
  }
  if ((in_ESI != 5) ||
     (((bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(QPointF_const&)>
                          (in_RCX,(void **)offsetChanged,0,0), !bVar3 &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(double)>
                          (in_RCX,(void **)blurRadiusChanged,0,1), !bVar3)) &&
      (bVar3 = QtMocHelpers::indexOfMethod<void(QGraphicsDropShadowEffect::*)(QColor_const&)>
                         (in_RCX,(void **)colorChanged,0,2), !bVar3)))) {
    if (in_ESI == 1) {
      pqVar2 = *(qreal **)in_RCX;
      in_stack_ffffffffffffff58 = (QGraphicsDropShadowEffect *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff58) {
      case (QGraphicsDropShadowEffect *)0x0:
        QVar6 = offset((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff50);
        local_28 = QVar6.xp;
        *pqVar2 = local_28;
        local_20 = QVar6.yp;
        pqVar2[1] = local_20;
        break;
      case (QGraphicsDropShadowEffect *)0x1:
        qVar4 = xOffset((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff48);
        *pqVar2 = qVar4;
        break;
      case (QGraphicsDropShadowEffect *)0x2:
        qVar4 = yOffset((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff48);
        *pqVar2 = qVar4;
        break;
      case (QGraphicsDropShadowEffect *)0x3:
        qVar4 = blurRadius((QGraphicsDropShadowEffect *)in_stack_ffffffffffffff50);
        *pqVar2 = qVar4;
        break;
      case (QGraphicsDropShadowEffect *)0x4:
        QVar5 = QGraphicsDropShadowEffect::color(in_stack_ffffffffffffff58);
        local_38 = QVar5._0_8_;
        local_30 = QVar5.ct._4_4_;
        uStack_2c = QVar5.ct._8_2_;
        *pqVar2 = local_38;
        *(undefined4 *)(pqVar2 + 1) = local_30;
        *(undefined2 *)((long)pqVar2 + 0xc) = uStack_2c;
      }
    }
    if (in_ESI == 2) {
      color = (QColor *)(ulong)in_EDX;
      switch(color) {
      case (QColor *)0x0:
        setOffset(in_stack_ffffffffffffff58,(QPointF *)color);
        break;
      case (QColor *)0x1:
        setXOffset(*(QGraphicsDropShadowEffect **)in_RCX,(qreal)in_stack_ffffffffffffff60);
        break;
      case (QColor *)0x2:
        setYOffset(in_stack_ffffffffffffff58,(qreal)color);
        break;
      case (QColor *)0x3:
        setBlurRadius(in_stack_ffffffffffffff60,(qreal)in_stack_ffffffffffffff58);
        break;
      case (QColor *)0x4:
        setColor(in_stack_ffffffffffffff58,color);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsDropShadowEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->offsetChanged((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 1: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 2: _t->colorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 3: _t->setOffset((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 4: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qreal>>(_a[2]))); break;
        case 5: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 6: _t->setXOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 7: _t->setYOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 9: _t->setColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QPointF & )>(_a, &QGraphicsDropShadowEffect::offsetChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(qreal )>(_a, &QGraphicsDropShadowEffect::blurRadiusChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QColor & )>(_a, &QGraphicsDropShadowEffect::colorChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPointF*>(_v) = _t->offset(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xOffset(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yOffset(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 4: *reinterpret_cast<QColor*>(_v) = _t->color(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOffset(*reinterpret_cast<QPointF*>(_v)); break;
        case 1: _t->setXOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast<QColor*>(_v)); break;
        default: break;
        }
    }
}